

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

BrotliEncoderState *
BrotliEncoderCreateInstance(brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  undefined8 uVar1;
  BrotliEncoderState *params;
  
  if (alloc_func == (brotli_alloc_func)0x0 && free_func == (brotli_free_func)0x0) {
    params = (BrotliEncoderState *)malloc(0x19d8);
  }
  else {
    if (alloc_func == (brotli_alloc_func)0x0 || free_func == (brotli_free_func)0x0) {
      return (BrotliEncoderState *)0x0;
    }
    params = (BrotliEncoderState *)(*alloc_func)(opaque,0x19d8);
  }
  if (params == (BrotliEncoderState *)0x0) {
    return (BrotliEncoderState *)0x0;
  }
  BrotliInitMemoryManager(&params->memory_manager_,alloc_func,free_func,opaque);
  BrotliEncoderInitParams(&params->params);
  params->input_pos_ = 0;
  params->prev_byte_ = '\0';
  params->prev_byte2_ = '\0';
  params->stream_state_ = BROTLI_STREAM_PROCESSING;
  params->is_last_block_emitted_ = 0;
  params->is_initialized_ = 0;
  (params->ringbuffer_).cur_size_ = 0;
  (params->ringbuffer_).pos_ = 0;
  (params->ringbuffer_).data_ = (uint8_t *)0x0;
  (params->ringbuffer_).buffer_ = (uint8_t *)0x0;
  params->cmd_alloc_size_ = 0;
  params->commands_ = (Command_conflict *)0x0;
  params->num_commands_ = 0;
  params->num_literals_ = 0;
  params->last_insert_len_ = 0;
  params->last_flush_pos_ = 0;
  params->last_processed_pos_ = 0;
  params->storage_size_ = 0;
  params->storage_ = (uint8_t *)0x0;
  (params->hasher_).common.extra = (void *)0x0;
  params->large_table_ = (int *)0x0;
  params->large_table_size_ = 0;
  params->cmd_code_numbits_ = 0;
  params->command_buf_ = (uint32_t *)0x0;
  params->literal_buf_ = (uint8_t *)0x0;
  params->next_out_ = (uint8_t *)0x0;
  params->available_out_ = 0;
  params->total_out_ = 0;
  params->dist_cache_[0] = 4;
  params->dist_cache_[1] = 0xb;
  params->dist_cache_[2] = 0xf;
  params->dist_cache_[3] = 0x10;
  uVar1 = *(undefined8 *)(params->dist_cache_ + 2);
  *(undefined8 *)params->saved_dist_cache_ = *(undefined8 *)params->dist_cache_;
  *(undefined8 *)(params->saved_dist_cache_ + 2) = uVar1;
  params->back_refs_position_ = 0;
  params->current_block_literals_ = 0;
  params->current_block_cmds_ = 0;
  return params;
}

Assistant:

BrotliEncoderState* BrotliEncoderCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliEncoderState* state = 0;
  if (!alloc_func && !free_func) {
    state = (BrotliEncoderState*)malloc(sizeof(BrotliEncoderState));
  } else if (alloc_func && free_func) {
    state = (BrotliEncoderState*)alloc_func(opaque, sizeof(BrotliEncoderState));
  }
  if (state == 0) {
    /* BROTLI_DUMP(); */
    return 0;
  }
  BrotliInitMemoryManager(
      &state->memory_manager_, alloc_func, free_func, opaque);
  BrotliEncoderInitState(state);
  state->back_refs_position_ = 0;
  state->current_block_literals_ = 0;
  state->current_block_cmds_ = 0;
  return state;
}